

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTRealTraffic.cpp
# Opt level: O1

void __thiscall RealTrafficConnection::StopTcpConnection(RealTrafficConnection *this)

{
  pthread_t pVar1;
  pthread_t pVar2;
  
  this->eTcpThrStatus = THR_STOP;
  XPMP2::TCPConnection::Close(&this->tcpPosSender);
  pVar2 = pthread_self();
  pVar1 = (this->thrTcpServer)._M_id._M_thread;
  if (pVar2 != pVar1) {
    if (pVar1 != 0) {
      std::thread::join();
    }
    if ((this->thrTcpServer)._M_id._M_thread != 0) {
      std::terminate();
    }
    (this->thrTcpServer)._M_id._M_thread = 0;
    this->eTcpThrStatus = THR_NONE;
  }
  return;
}

Assistant:

void RealTrafficConnection::StopTcpConnection ()
{
    // close all connections, this will also break out of all
    // blocking calls for receiving message and hence terminate the threads
    eTcpThrStatus = THR_STOP;
    tcpPosSender.Close();
    
    // wait for threads to finish (if I'm not myself this thread...)
    if (std::this_thread::get_id() != thrTcpServer.get_id()) {
        if (thrTcpServer.joinable())
            thrTcpServer.join();
        thrTcpServer = std::thread();
        eTcpThrStatus = THR_NONE;
    }
}